

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  AlphaNum *in_R8;
  string result;
  string local_c8;
  AlphaNum local_a8;
  string_view local_78 [3];
  AlphaNum local_48;
  
  GetFileNamespace_abi_cxx11_(&result,this,descriptor);
  if (result._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&result);
  }
  local_78[0] = absl::lts_20250127::NullSafeStringView("global::");
  local_a8.piece_._M_len = result._M_string_length;
  local_a8.piece_._M_str = result._M_dataplus._M_p;
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_c8,this,(FileDescriptor *)local_78[0]._M_str);
  local_48.piece_._M_len = local_c8._M_string_length;
  local_48.piece_._M_str = local_c8._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_78,&local_a8,&local_48,in_R8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassName(const FileDescriptor* descriptor) {
  std::string result = GetFileNamespace(descriptor);
  if (!result.empty()) {
    result += '.';
  }
  return absl::StrCat("global::", result,
                      GetReflectionClassUnqualifiedName(descriptor));
}